

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1027:27),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1029:6)>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:1027:27),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:1029:6)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  ExceptionOrValue local_2e0;
  char local_180;
  ExceptionOrValue local_178;
  char local_18;
  
  local_178.exception.ptr.isSet = false;
  local_18 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_178);
  if (local_178.exception.ptr.isSet == true) {
    local_2e0.exception.ptr.isSet = false;
    local_180 = '\x01';
    ExceptionOrValue::operator=(output,&local_2e0);
  }
  else {
    if (local_18 != '\x01') goto LAB_002904ef;
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[14]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x404,ERROR,"\"didn\'t throw?\"",(char (*) [14])"didn\'t throw?");
    }
    local_2e0.exception.ptr.isSet = false;
    local_180 = '\x01';
    ExceptionOrValue::operator=(output,&local_2e0);
  }
  if (&local_2e0 != output) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
    }
    if (local_180 == '\x01') {
      output[1].exception.ptr.isSet = true;
    }
  }
  if (local_2e0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_2e0.exception.ptr.field_1.value);
  }
LAB_002904ef:
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }